

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::SegmentInfo::Finalize(SegmentInfo *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  
  if (writer != (IMkvWriter *)0x0) {
    if (this->duration_ <= 0.0) {
      return true;
    }
    iVar2 = (*writer->_vptr_IMkvWriter[3])(writer);
    if ((char)iVar2 == '\0') {
      return true;
    }
    if (this->duration_pos_ != -1) {
      iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
      iVar3 = (*writer->_vptr_IMkvWriter[2])(writer,this->duration_pos_);
      if (((iVar3 == 0) && (bVar1 = WriteEbmlElement(writer,0x4489,(float)this->duration_), bVar1))
         && (iVar2 = (*writer->_vptr_IMkvWriter[2])(writer,CONCAT44(extraout_var,iVar2)), iVar2 == 0
            )) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SegmentInfo::Finalize(IMkvWriter* writer) const {
  if (!writer)
    return false;

  if (duration_ > 0.0) {
    if (writer->Seekable()) {
      if (duration_pos_ == -1)
        return false;

      const int64_t pos = writer->Position();

      if (writer->Position(duration_pos_))
        return false;

      if (!WriteEbmlElement(writer, libwebm::kMkvDuration,
                            static_cast<float>(duration_)))
        return false;

      if (writer->Position(pos))
        return false;
    }
  }

  return true;
}